

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

PixelBufferAccess * __thiscall
sglr::ReferenceContext::getFboAttachment
          (PixelBufferAccess *__return_storage_ptr__,ReferenceContext *this,Framebuffer *framebuffer
          ,AttachmentPoint point)

{
  undefined8 *puVar1;
  AttachmentType AVar2;
  _Rb_tree_color _Var3;
  int iVar4;
  uint uVar5;
  long lVar6;
  TextureFormat *pTVar7;
  TestError *this_00;
  _Base_ptr p_Var8;
  long lVar9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  int i_2;
  bool bVar12;
  PixelBufferAccess level;
  
  AVar2 = framebuffer->m_attachments[point].type;
  if (AVar2 == ATTACHMENTTYPE_RENDERBUFFER) {
    p_Var10 = (this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent;
    if (p_Var10 != (_Base_ptr)0x0) {
      _Var3 = framebuffer->m_attachments[point].name;
      p_Var11 = &(this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = &p_Var11->_M_header;
      do {
        bVar12 = p_Var10[1]._M_color < _Var3;
        if (!bVar12) {
          p_Var8 = p_Var10;
        }
        p_Var10 = (&p_Var10->_M_left)[bVar12];
      } while (p_Var10 != (_Base_ptr)0x0);
      if ((((_Rb_tree_header *)p_Var8 != p_Var11) && (p_Var8[1]._M_color <= _Var3)) &&
         (p_Var8[1]._M_parent != (_Base_ptr)0x0)) {
        tcu::TextureLevel::getAccess
                  (__return_storage_ptr__,(TextureLevel *)&(p_Var8[1]._M_parent)->_M_left);
        return __return_storage_ptr__;
      }
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"rbo",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
               ,0x941);
  }
  else {
    if (AVar2 != ATTACHMENTTYPE_TEXTURE) {
LAB_0189f3da:
      level.super_ConstPixelBufferAccess.m_format.order = R;
      level.super_ConstPixelBufferAccess.m_format.type = UNSIGNED_INT8;
      tcu::PixelBufferAccess::PixelBufferAccess
                (__return_storage_ptr__,(TextureFormat *)&level,0,0,0,(void *)0x0);
      return __return_storage_ptr__;
    }
    p_Var10 = (this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var10 != (_Base_ptr)0x0) {
      _Var3 = framebuffer->m_attachments[point].name;
      p_Var11 = &(this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = &p_Var11->_M_header;
      do {
        bVar12 = p_Var10[1]._M_color < _Var3;
        if (!bVar12) {
          p_Var8 = p_Var10;
        }
        p_Var10 = (&p_Var10->_M_left)[bVar12];
      } while (p_Var10 != (_Base_ptr)0x0);
      if ((((_Rb_tree_header *)p_Var8 != p_Var11) && (p_Var8[1]._M_color <= _Var3)) &&
         (p_Var10 = p_Var8[1]._M_parent, p_Var10 != (_Base_ptr)0x0)) {
        iVar4 = *(int *)&p_Var10->_M_left;
        if (iVar4 - 3U < 3) {
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&level.super_ConstPixelBufferAccess);
          uVar5 = *(int *)&p_Var10->_M_left - 3;
          if (uVar5 < 3) {
            lVar6 = __dynamic_cast(p_Var10,&rc::Texture::typeinfo,(&PTR_typeinfo_0217dba0)[uVar5],0)
            ;
            lVar9 = (long)framebuffer->m_attachments[point].level;
            level.super_ConstPixelBufferAccess.m_data = *(void **)(lVar6 + 0x160 + lVar9 * 0x28);
            pTVar7 = (TextureFormat *)(lVar6 + 0x140 + lVar9 * 0x28);
            level.super_ConstPixelBufferAccess.m_format = *pTVar7;
            level.super_ConstPixelBufferAccess.m_size.m_data._0_8_ = pTVar7[1];
            puVar1 = (undefined8 *)(lVar6 + 0x150 + lVar9 * 0x28);
            level.super_ConstPixelBufferAccess._16_8_ = *puVar1;
            level.super_ConstPixelBufferAccess.m_pitch.m_data._4_8_ = puVar1[1];
          }
          tcu::PixelBufferAccess::PixelBufferAccess
                    (__return_storage_ptr__,(TextureFormat *)&level,
                     level.super_ConstPixelBufferAccess.m_size.m_data[0],
                     level.super_ConstPixelBufferAccess.m_size.m_data[1],1,
                     level.super_ConstPixelBufferAccess.m_pitch.m_data[1],0,
                     (void *)((long)(framebuffer->m_attachments[point].layer *
                                    level.super_ConstPixelBufferAccess.m_pitch.m_data[2]) +
                             (long)level.super_ConstPixelBufferAccess.m_data));
          return __return_storage_ptr__;
        }
        if (iVar4 == 2) {
          lVar9 = __dynamic_cast(p_Var10,&rc::Texture::typeinfo,&rc::TextureCube::typeinfo,0);
          uVar5 = framebuffer->m_attachments[point].texTarget - TEXTARGET_CUBE_MAP_POSITIVE_X;
          lVar6 = 6;
          if (uVar5 < 6) {
            lVar6 = *(long *)(&DAT_01cb4ad8 + (ulong)uVar5 * 8);
          }
          lVar6 = lVar9 + lVar6 * 0x540 + (long)framebuffer->m_attachments[point].level * 0x28;
          pTVar7 = (TextureFormat *)(lVar6 + 0x140);
          (__return_storage_ptr__->super_ConstPixelBufferAccess).m_format = *pTVar7;
          lVar9 = 0;
          do {
            (__return_storage_ptr__->super_ConstPixelBufferAccess).m_size.m_data[lVar9] =
                 *(int *)(lVar6 + 0x148 + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          lVar9 = 0;
          do {
            (__return_storage_ptr__->super_ConstPixelBufferAccess).m_pitch.m_data[lVar9] =
                 *(int *)(lVar6 + 0x154 + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
        }
        else {
          if (iVar4 != 1) goto LAB_0189f3da;
          lVar9 = 0;
          lVar6 = __dynamic_cast(p_Var10,&rc::Texture::typeinfo,&rc::Texture2D::typeinfo,0);
          lVar6 = lVar6 + (long)framebuffer->m_attachments[point].level * 0x28;
          pTVar7 = (TextureFormat *)(lVar6 + 0x140);
          (__return_storage_ptr__->super_ConstPixelBufferAccess).m_format = *pTVar7;
          do {
            (__return_storage_ptr__->super_ConstPixelBufferAccess).m_size.m_data[lVar9] =
                 *(int *)(lVar6 + 0x148 + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          lVar9 = 0;
          do {
            (__return_storage_ptr__->super_ConstPixelBufferAccess).m_pitch.m_data[lVar9] =
                 *(int *)(lVar6 + 0x154 + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
        }
        (__return_storage_ptr__->super_ConstPixelBufferAccess).m_data = (void *)pTVar7[4];
        return __return_storage_ptr__;
      }
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"texture",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
               ,0x923);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::PixelBufferAccess ReferenceContext::getFboAttachment (const rc::Framebuffer& framebuffer, rc::Framebuffer::AttachmentPoint point)
{
	const Framebuffer::Attachment& attachment = framebuffer.getAttachment(point);

	switch (attachment.type)
	{
		case Framebuffer::ATTACHMENTTYPE_TEXTURE:
		{
			Texture* texture = m_textures.find(attachment.name);
			TCU_CHECK(texture);

			if (texture->getType() == Texture::TYPE_2D)
				return dynamic_cast<Texture2D*>(texture)->getLevel(attachment.level);
			else if (texture->getType() == Texture::TYPE_CUBE_MAP)
				return dynamic_cast<TextureCube*>(texture)->getFace(attachment.level, texTargetToFace(attachment.texTarget));
			else if (texture->getType() == Texture::TYPE_2D_ARRAY	||
					 texture->getType() == Texture::TYPE_3D			||
					 texture->getType() == Texture::TYPE_CUBE_MAP_ARRAY)
			{
				tcu::PixelBufferAccess level;

				if (texture->getType() == Texture::TYPE_2D_ARRAY)
					level = dynamic_cast<Texture2DArray*>(texture)->getLevel(attachment.level);
				else if (texture->getType() == Texture::TYPE_3D)
					level = dynamic_cast<Texture3D*>(texture)->getLevel(attachment.level);
				else if (texture->getType() == Texture::TYPE_CUBE_MAP_ARRAY)
					level = dynamic_cast<TextureCubeArray*>(texture)->getLevel(attachment.level);

				void* layerData = static_cast<deUint8*>(level.getDataPtr()) + level.getSlicePitch() * attachment.layer;

				return tcu::PixelBufferAccess(level.getFormat(), level.getWidth(), level.getHeight(), 1, level.getRowPitch(), 0, layerData);
			}
			else
				return nullAccess();
		}

		case Framebuffer::ATTACHMENTTYPE_RENDERBUFFER:
		{
			Renderbuffer* rbo = m_renderbuffers.find(attachment.name);
			TCU_CHECK(rbo);

			return rbo->getAccess();
		}

		default:
			return nullAccess();
	}
}